

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::AV1ConvolveXHighbdCompoundTest_RunTest_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::AV1ConvolveXHighbdCompoundTest_RunTest_Test>
           *this)

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*,_int)>_>
  ::SetParam((ParamType *)(in_RDI + 8));
  this_00 = (Test *)operator_new(0x1cb80);
  anon_unknown.dwarf_e304c3::AV1ConvolveXHighbdCompoundTest_RunTest_Test::
  AV1ConvolveXHighbdCompoundTest_RunTest_Test
            ((AV1ConvolveXHighbdCompoundTest_RunTest_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }